

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

void dump_monsters(ang_file *fff)

{
  angband_constants *paVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 4;
  paVar1 = z_info;
  for (uVar2 = 0; uVar2 < paVar1->r_max; uVar2 = uVar2 + 1) {
    if (*(long *)(r_info->flags + lVar3 * 4 + -0x5c) != 0) {
      file_putf(fff,"monster:%s:0x%02X:0x%02X\n",*(long *)(r_info->flags + lVar3 * 4 + -0x5c),
                (ulong)monster_x_attr[uVar2],(ulong)(uint)monster_x_char[uVar2]);
      paVar1 = z_info;
    }
    lVar3 = lVar3 + 0x34;
  }
  return;
}

Assistant:

void dump_monsters(ang_file *fff)
{
	int i;

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		uint8_t attr = monster_x_attr[i];
		wint_t chr = monster_x_char[i];

		/* Skip non-entries */
		if (!race->name) continue;

		file_putf(fff, "monster:%s:0x%02X:0x%02X\n", race->name, attr, chr);
	}
}